

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

int __thiscall deqp::gles31::Functional::DebugTests::init(DebugTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Context *pCVar4;
  anon_union_8_2_9b810bd7_for_m_func aVar5;
  undefined8 uVar6;
  uint uVar7;
  deUint32 dVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int extraout_EAX_11;
  int extraout_EAX_12;
  int extraout_EAX_13;
  int extraout_EAX_14;
  int extraout_EAX_15;
  int extraout_EAX_16;
  int extraout_EAX_17;
  int extraout_EAX_18;
  int extraout_EAX_19;
  TestNode *pTVar9;
  long *plVar10;
  TestNode *pTVar11;
  TestNode *pTVar12;
  BaseCase *this_00;
  iterator iVar13;
  long *plVar14;
  FilterCase *pFVar15;
  AsyncCase *pAVar16;
  FunctionContainer *pFVar17;
  pointer pTVar18;
  long *plVar19;
  allocator_type *paVar20;
  int iVar21;
  TestFunctionWrapper *pTVar22;
  TestFunctionWrapper *pTVar23;
  uint uVar24;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  *this_01;
  undefined1 in_R9B;
  int iVar25;
  ulong uVar26;
  FunctionContainer *pFVar27;
  anon_union_8_2_9b810bd7_for_m_func *paVar28;
  long lVar29;
  ulong uVar30;
  string name;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  funcs_1;
  ostringstream s;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  containers;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  allFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  textureFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  bufferFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  computeFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderStorageFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  advancedBlendFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  preciseFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ssboBlockFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderDirectiveFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderFunctionFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageAtomicExchangeFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageAtomicFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageStoreFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageLoadFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  atomicCounterFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  tessellationFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  stateFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  vaFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  fragmentFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderFuncs;
  Random rng;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  TestNode *local_440;
  allocator_type *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  TestFunctionWrapper *local_418;
  TestNode *local_410;
  long *local_408 [2];
  long local_3f8 [2];
  anon_union_8_2_9b810bd7_for_m_func local_3e8;
  anon_union_8_2_9b810bd7_for_m_func aStack_3e0;
  FunctionContainer local_3d8 [4];
  ios_base local_378 [264];
  FunctionContainer *local_270;
  TestNode *local_268;
  ulong local_260;
  TestFunctionWrapper *local_258;
  const_iterator cStack_250;
  long local_248;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_240;
  TestFunctionWrapper *local_228;
  iterator iStack_220;
  TestFunctionWrapper *local_218;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_208;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_1f0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_1d8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_1c0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_1a8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_190;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_178;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_160;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_148;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_130;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_118;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_100;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_e8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_d0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_b8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_a0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_88;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_70;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_58;
  deRandom local_40;
  
  NegativeTestShared::getNegativeBufferApiTestFunctions();
  wrapCoreFunctions(&local_1f0,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeTextureApiTestFunctions();
  wrapCoreFunctions(&local_208,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderApiTestFunctions();
  wrapCoreFunctions(&local_58,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeFragmentApiTestFunctions();
  wrapCoreFunctions(&local_70,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeVertexArrayApiTestFunctions();
  wrapCoreFunctions(&local_88,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeStateApiTestFunctions();
  wrapCoreFunctions(&local_a0,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeTessellationTestFunctions();
  wrapCoreFunctions(&local_b8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeAtomicCounterTestFunctions();
  wrapCoreFunctions(&local_d0,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderImageLoadTestFunctions();
  wrapCoreFunctions(&local_e8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderImageStoreTestFunctions();
  wrapCoreFunctions(&local_100,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderImageAtomicTestFunctions();
  wrapCoreFunctions(&local_118,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderImageAtomicExchangeTestFunctions();
  wrapCoreFunctions(&local_130,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderFunctionTestFunctions();
  wrapCoreFunctions(&local_148,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderDirectiveTestFunctions();
  wrapCoreFunctions(&local_160,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeSSBOBlockTestFunctions();
  wrapCoreFunctions(&local_178,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativePreciseTestFunctions();
  wrapCoreFunctions(&local_190,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeAdvancedBlendEquationTestFunctions();
  wrapCoreFunctions(&local_1a8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderStorageTestFunctions();
  wrapCoreFunctions(&local_1c0,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeComputeTestFunctions();
  wrapCoreFunctions(&local_1d8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x60);
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_240.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ._M_impl.super__Vector_impl_data._M_start + 3;
  ((local_240.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
    ._M_impl.super__Vector_impl_data._M_start)->function).m_type = TYPE_DEBUG;
  ((local_240.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
    ._M_impl.super__Vector_impl_data._M_start)->function).m_func.coreFn =
       anon_unknown_1::application_messages;
  (local_240.
   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
   ._M_impl.super__Vector_impl_data._M_start)->name = "application_messages";
  (local_240.
   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
   ._M_impl.super__Vector_impl_data._M_start)->desc =
       "Externally generated messages from the application";
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[1].function.m_type = TYPE_DEBUG;
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[1].function.m_func.coreFn =
       anon_unknown_1::thirdparty_messages;
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[1].name = "third_party_messages";
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[1].desc =
       "Externally generated messages from a third party";
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[2].function.m_type = TYPE_DEBUG;
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[2].function.m_func.coreFn =
       anon_unknown_1::push_pop_messages;
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[2].name = "push_pop_stack";
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[2].desc = "Messages from pushing/popping debug groups";
  local_240.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_240.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "State query");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  local_418 = (TestFunctionWrapper *)0x14;
  local_440 = pTVar9;
  do {
    pTVar9 = (TestNode *)operator_new(0x88);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_268 = *(TestNode **)((long)&PTR_deinit_00b26b38 + (long)local_418 + 4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,(char *)local_268,(allocator<char> *)&local_258);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
    local_3e8.coreFn = (CoreTestFunc)local_3d8;
    pFVar17 = (FunctionContainer *)(plVar10 + 2);
    if ((FunctionContainer *)*plVar10 == pFVar17) {
      local_3d8[0].function = pFVar17->function;
      local_3d8[0].name = (char *)plVar10[3];
    }
    else {
      local_3d8[0].function = pFVar17->function;
      local_3e8.coreFn = (CoreTestFunc)*plVar10;
    }
    aVar5 = local_3e8;
    aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
    *plVar10 = (long)pFVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_408[0] = local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Test ","");
    local_260 = *(ulong *)((long)&PTR_iterate_00b26b40 + (long)local_418 + 4);
    plVar10 = (long *)std::__cxx11::string::append((char *)local_408);
    local_438 = (allocator_type *)&local_428;
    paVar20 = (allocator_type *)(plVar10 + 2);
    if ((allocator_type *)*plVar10 == paVar20) {
      local_428 = *(long *)paVar20;
      lStack_420 = plVar10[3];
    }
    else {
      local_428 = *(long *)paVar20;
      local_438 = (allocator_type *)*plVar10;
    }
    local_430 = plVar10[1];
    *plVar10 = (long)paVar20;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    uVar2 = *(undefined4 *)(&UNK_00b26b4c + (long)local_418);
    uVar3 = *(undefined4 *)((long)&init::limits[0].name + (long)local_418);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)aVar5.coreFn,(char *)local_438);
    pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26cc8;
    *(undefined4 *)&pTVar9[1].m_testCtx = 0;
    *(undefined4 *)((long)&pTVar9[1].m_testCtx + 4) = uVar3;
    *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = uVar2;
    tcu::TestNode::addChild(local_440,pTVar9);
    local_410 = (TestNode *)CONCAT44(local_410._4_4_,uVar2);
    local_270 = (FunctionContainer *)CONCAT44(local_270._4_4_,uVar3);
    if (local_438 != (allocator_type *)&local_428) {
      operator_delete(local_438,local_428 + 1);
    }
    pTVar9 = local_268;
    if (local_408[0] != local_3f8) {
      operator_delete(local_408[0],local_3f8[0] + 1);
    }
    if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
      operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
    }
    if (local_460 != &local_450) {
      operator_delete(local_460,local_450 + 1);
    }
    pTVar11 = (TestNode *)operator_new(0x88);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,(char *)pTVar9,(allocator<char> *)&local_258);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
    local_3e8.coreFn = (CoreTestFunc)local_3d8;
    pFVar17 = (FunctionContainer *)(plVar10 + 2);
    if ((FunctionContainer *)*plVar10 == pFVar17) {
      local_3d8[0].function = pFVar17->function;
      local_3d8[0].name = (char *)plVar10[3];
    }
    else {
      local_3d8[0].function = pFVar17->function;
      local_3e8.coreFn = (CoreTestFunc)*plVar10;
    }
    aVar5 = local_3e8;
    aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
    *plVar10 = (long)pFVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_408[0] = local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Test ","");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_408);
    local_438 = (allocator_type *)&local_428;
    paVar20 = (allocator_type *)(plVar10 + 2);
    if ((allocator_type *)*plVar10 == paVar20) {
      local_428 = *(long *)paVar20;
      lStack_420 = plVar10[3];
    }
    else {
      local_428 = *(long *)paVar20;
      local_438 = (allocator_type *)*plVar10;
    }
    local_430 = plVar10[1];
    *plVar10 = (long)paVar20;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar11,pCVar4->m_testCtx,(char *)aVar5.coreFn,(char *)local_438);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26cc8;
    *(undefined4 *)&pTVar11[1].m_testCtx = 3;
    *(undefined4 *)((long)&pTVar11[1].m_testCtx + 4) = local_270._0_4_;
    *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = local_410._0_4_;
    tcu::TestNode::addChild(local_440,pTVar11);
    if (local_438 != (allocator_type *)&local_428) {
      operator_delete(local_438,local_428 + 1);
    }
    if (local_408[0] != local_3f8) {
      operator_delete(local_408[0],local_3f8[0] + 1);
    }
    if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
      operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
    }
    if (local_460 != &local_450) {
      operator_delete(local_460,local_450 + 1);
    }
    pTVar11 = (TestNode *)operator_new(0x88);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,(char *)pTVar9,(allocator<char> *)&local_258);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
    local_3e8.coreFn = (CoreTestFunc)local_3d8;
    pFVar17 = (FunctionContainer *)(plVar10 + 2);
    if ((FunctionContainer *)*plVar10 == pFVar17) {
      local_3d8[0].function = pFVar17->function;
      local_3d8[0].name = (char *)plVar10[3];
    }
    else {
      local_3d8[0].function = pFVar17->function;
      local_3e8.coreFn = (CoreTestFunc)*plVar10;
    }
    aVar5 = local_3e8;
    aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
    *plVar10 = (long)pFVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_408[0] = local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Test ","");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_408);
    local_438 = (allocator_type *)&local_428;
    paVar20 = (allocator_type *)(plVar10 + 2);
    if ((allocator_type *)*plVar10 == paVar20) {
      local_428 = *(long *)paVar20;
      lStack_420 = plVar10[3];
    }
    else {
      local_428 = *(long *)paVar20;
      local_438 = (allocator_type *)*plVar10;
    }
    local_430 = plVar10[1];
    *plVar10 = (long)paVar20;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar11,pCVar4->m_testCtx,(char *)aVar5.coreFn,(char *)local_438);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26cc8;
    *(undefined4 *)&pTVar11[1].m_testCtx = 4;
    *(undefined4 *)((long)&pTVar11[1].m_testCtx + 4) = local_270._0_4_;
    *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = local_410._0_4_;
    tcu::TestNode::addChild(local_440,pTVar11);
    if (local_438 != (allocator_type *)&local_428) {
      operator_delete(local_438,local_428 + 1);
    }
    if (local_408[0] != local_3f8) {
      operator_delete(local_408[0],local_3f8[0] + 1);
    }
    if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
      operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
    }
    if (local_460 != &local_450) {
      operator_delete(local_460,local_450 + 1);
    }
    pTVar11 = (TestNode *)operator_new(0x88);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,(char *)pTVar9,(allocator<char> *)&local_258);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
    uVar2 = local_410._0_4_;
    local_3e8.coreFn = (CoreTestFunc)local_3d8;
    pFVar17 = (FunctionContainer *)(plVar10 + 2);
    if ((FunctionContainer *)*plVar10 == pFVar17) {
      local_3d8[0].function = pFVar17->function;
      local_3d8[0].name = (char *)plVar10[3];
    }
    else {
      local_3d8[0].function = pFVar17->function;
      local_3e8.coreFn = (CoreTestFunc)*plVar10;
    }
    aVar5 = local_3e8;
    aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
    *plVar10 = (long)pFVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_408[0] = local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Test ","");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_408);
    local_438 = (allocator_type *)&local_428;
    paVar20 = (allocator_type *)(plVar10 + 2);
    if ((allocator_type *)*plVar10 == paVar20) {
      local_428 = *(long *)paVar20;
      lStack_420 = plVar10[3];
    }
    else {
      local_428 = *(long *)paVar20;
      local_438 = (allocator_type *)*plVar10;
    }
    local_430 = plVar10[1];
    *plVar10 = (long)paVar20;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar11,pCVar4->m_testCtx,(char *)aVar5.coreFn,(char *)local_438);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26cc8;
    *(undefined4 *)&pTVar11[1].m_testCtx = 5;
    *(undefined4 *)((long)&pTVar11[1].m_testCtx + 4) = local_270._0_4_;
    *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = uVar2;
    tcu::TestNode::addChild(local_440,pTVar11);
    if (local_438 != (allocator_type *)&local_428) {
      operator_delete(local_438,local_428 + 1);
    }
    if (local_408[0] != local_3f8) {
      operator_delete(local_408[0],local_3f8[0] + 1);
    }
    if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
      operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
    }
    if (local_460 != &local_450) {
      operator_delete(local_460,local_450 + 1);
    }
    local_418 = (TestFunctionWrapper *)((long)local_418 + 0x18);
  } while (local_418 != (TestFunctionWrapper *)0x74);
  pTVar9 = (TestNode *)operator_new(0x88);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_output","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
    local_3e8.coreFn = (CoreTestFunc)local_3d8;
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,"Test DEBUG_OUTPUT");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d18;
  pTVar9[1].m_testCtx = (TestContext *)0x92e000000002;
  *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x88);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_output","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,"Test DEBUG_OUTPUT");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d18;
  pTVar9[1].m_testCtx = (TestContext *)0x92e000000000;
  *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x88);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_output","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,"Test DEBUG_OUTPUT");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d18;
  pTVar9[1].m_testCtx = (TestContext *)0x92e000000003;
  *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x88);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_output","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,"Test DEBUG_OUTPUT");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d18;
  pTVar9[1].m_testCtx = (TestContext *)0x92e000000004;
  *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x88);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_output","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,"Test DEBUG_OUTPUT");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d18;
  pTVar9[1].m_testCtx = (TestContext *)0x92e000000005;
  *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x88);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,"debug_output_synchronous","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT_SYNCHRONOUS");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d18;
  pTVar9[1].m_testCtx = (TestContext *)0x824200000002;
  *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x88);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,"debug_output_synchronous","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT_SYNCHRONOUS");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d18;
  pTVar9[1].m_testCtx = (TestContext *)0x824200000000;
  *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x88);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,"debug_output_synchronous","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT_SYNCHRONOUS");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d18;
  pTVar9[1].m_testCtx = (TestContext *)0x824200000003;
  *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x88);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,"debug_output_synchronous","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT_SYNCHRONOUS");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d18;
  pTVar9[1].m_testCtx = (TestContext *)0x824200000004;
  *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x88);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,"debug_output_synchronous","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT_SYNCHRONOUS");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d18;
  pTVar9[1].m_testCtx = (TestContext *)0x824200000005;
  *(undefined4 *)&pTVar9[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_logged_messages","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
    local_3e8.coreFn = (CoreTestFunc)local_3d8;
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_LOGGED_MESSAGES");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d68;
  pTVar9[1].m_testCtx = (TestContext *)0x914500000000;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_logged_messages","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_LOGGED_MESSAGES");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d68;
  pTVar9[1].m_testCtx = (TestContext *)0x914500000003;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_logged_messages","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_LOGGED_MESSAGES");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d68;
  pTVar9[1].m_testCtx = (TestContext *)0x914500000004;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_logged_messages","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_LOGGED_MESSAGES");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d68;
  pTVar9[1].m_testCtx = (TestContext *)0x914500000005;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,"debug_next_logged_message_length","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d68;
  pTVar9[1].m_testCtx = (TestContext *)0x824300000000;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,"debug_next_logged_message_length","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d68;
  pTVar9[1].m_testCtx = (TestContext *)0x824300000003;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,"debug_next_logged_message_length","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d68;
  pTVar9[1].m_testCtx = (TestContext *)0x824300000004;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,"debug_next_logged_message_length","");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26d68;
  pTVar9[1].m_testCtx = (TestContext *)0x824300000005;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_group_stack_depth","")
  ;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
    local_3e8.coreFn = (CoreTestFunc)local_3d8;
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_GROUP_STACK_DEPTH");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26db8;
  *(undefined4 *)&pTVar9[1].m_testCtx = 0;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_group_stack_depth","")
  ;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_GROUP_STACK_DEPTH");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26db8;
  *(undefined4 *)&pTVar9[1].m_testCtx = 3;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_group_stack_depth","")
  ;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar17 = (FunctionContainer *)(plVar10 + 2);
  if ((FunctionContainer *)*plVar10 == pFVar17) {
    local_3d8[0].function = pFVar17->function;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = pFVar17->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar10[1];
  *plVar10 = (long)pFVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_GROUP_STACK_DEPTH");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26db8;
  *(undefined4 *)&pTVar9[1].m_testCtx = 4;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar9 = (TestNode *)operator_new(0x80);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  local_460 = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"debug_group_stack_depth","")
  ;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pTVar18 = (pointer)(plVar10 + 2);
  if ((pointer)*plVar10 == pTVar18) {
    local_3d8[0].function = *(TestFunc *)pTVar18;
    local_3d8[0].name = (char *)plVar10[3];
  }
  else {
    local_3d8[0].function = *(TestFunc *)pTVar18;
    local_3e8.coreFn = (CoreTestFunc)*plVar10;
  }
  aStack_3e0 = *(anon_union_8_2_9b810bd7_for_m_func *)(plVar10 + 1);
  *plVar10 = (long)pTVar18;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,pCVar4->m_testCtx,(char *)local_3e8.coreFn,
             "Test DEBUG_GROUP_STACK_DEPTH");
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26db8;
  *(undefined4 *)&pTVar9[1].m_testCtx = 5;
  tcu::TestNode::addChild(local_440,pTVar9);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x78);
  pTVar9 = local_440;
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar4->m_testCtx,"debug_callback_function_getpointer",
             "Test DEBUG_CALLBACK_FUNCTION");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26e08;
  tcu::TestNode::addChild(pTVar9,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar4->m_testCtx,"debug_callback_user_param_getpointer",
             "Test DEBUG_CALLBACK_USER_PARAM");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b26e58;
  tcu::TestNode::addChild(pTVar9,pTVar11);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "negative_coverage","API error coverage with various reporting methods");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"callbacks",
             "Reporting of standard API errors via callback");
  tcu::TestNode::addChild(pTVar9,pTVar11);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"buffer",
                              "Negative Buffer API Cases",&local_1f0)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"texture",
                              "Negative Texture API Cases",&local_208)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"shader",
                              "Negative Shader API Cases",&local_58)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"fragment",
                              "Negative Fragment API Cases",&local_70)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"vertex_array"
                              ,"Negative Vertex Array API Cases",&local_88)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"state",
                              "Negative GL State API Cases",&local_a0)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "atomic_counter","Negative Atomic Counter API Cases",&local_d0)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_load","Negative Shader Image Load API Cases",&local_e8)
             ->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_store","Negative Shader Image Store API Cases",
                              &local_100)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_atomic","Negative Shader Image Atomic API Cases",
                              &local_118)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_image_exchange",
                              "Negative Shader Image Atomic Exchange API Cases",&local_130)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_function","Negative Shader Function Cases",&local_148)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_directive","Negative Shader Directive Cases",&local_160)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"ssbo_block",
                              "Negative SSBO Block Cases",&local_178)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"precise",
                              "Negative Precise Cases",&local_190)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "advanced_blend","Negative Advanced Blend Equation Cases",&local_1a8)
             ->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                              "shader_storage","Negative Shader Storage Cases",&local_1c0)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"tessellation"
                              ,"Negative Tessellation Cases",&local_b8)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,"compute",
                              "Negative Compute Cases",&local_1d8)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"log",
             "Reporting of standard API errors via log");
  tcu::TestNode::addChild(pTVar9,pTVar11);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"buffer",
                              "Negative Buffer API Cases",&local_1f0)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"texture",
                              "Negative Texture API Cases",&local_208)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader",
                              "Negative Shader API Cases",&local_58)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"fragment",
                              "Negative Fragment API Cases",&local_70)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"vertex_array",
                              "Negative Vertex Array API Cases",&local_88)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"state",
                              "Negative GL State API Cases",&local_a0)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"atomic_counter",
                              "Negative Atomic Counter API Cases",&local_d0)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_image_load"
                              ,"Negative Shader Image Load API Cases",&local_e8)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,
                              "shader_image_store","Negative Shader Image Store API Cases",
                              &local_100)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,
                              "shader_image_atomic","Negative Shader Image Atomic API Cases",
                              &local_118)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,
                              "shader_image_exchange",
                              "Negative Shader Image Atomic Exchange API Cases",&local_130)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_function",
                              "Negative Shader Function Cases",&local_148)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_directive",
                              "Negative Shader Directive Cases",&local_160)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"ssbo_block",
                              "Negative SSBO Block Cases",&local_178)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"precise",
                              "Negative Precise Cases",&local_190)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"advanced_blend",
                              "Negative Advanced Blend Equation Cases",&local_1a8)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"shader_storage",
                              "Negative Shader Storage Cases",&local_1c0)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"tessellation",
                              "Negative Tessellation Cases",&local_b8)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = &createChildCases(CASETYPE_LOG,(this->super_TestCaseGroup).m_context,"compute",
                              "Negative Compute Cases",&local_1d8)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"get_error",
             "Reporting of standard API errors via glGetError");
  tcu::TestNode::addChild(pTVar9,pTVar11);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"buffer",
                             "Negative Buffer API Cases",&local_1f0)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"texture",
                             "Negative Texture API Cases",&local_208)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"shader",
                             "Negative Shader API Cases",&local_58)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"fragment",
                             "Negative Fragment API Cases",&local_70)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"vertex_array",
                             "Negative Vertex Array API Cases",&local_88)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"state",
                             "Negative GL State API Cases",&local_a0)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "atomic_counter","Negative Atomic Counter API Cases",&local_d0)->
            super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_image_load","Negative Shader Image Load API Cases",&local_e8)->
            super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_image_store","Negative Shader Image Store API Cases",&local_100
                            )->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_image_atomic","Negative Shader Image Atomic API Cases",
                             &local_118)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_image_exchange",
                             "Negative Shader Image Atomic Exchange API Cases",&local_130)->
            super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_function","Negative Shader Function Cases",&local_148)->
            super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_directive","Negative Shader Directive Cases",&local_160)->
            super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"ssbo_block",
                             "Negative SSBO Block Cases",&local_178)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"precise",
                             "Negative Precise Cases",&local_190)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "advanced_blend","Negative Advanced Blend Equation Cases",&local_1a8)->
            super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,
                             "shader_storage","Negative Shader Storage Cases",&local_1c0)->
            super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"tessellation",
                             "Negative Tessellation Cases",&local_b8)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_GETERROR,(this->super_TestCaseGroup).m_context,"compute",
                             "Negative Compute Cases",&local_1d8)->super_TestNode;
  tcu::TestNode::addChild(pTVar11,pTVar9);
  pTVar9 = &createChildCases(CASETYPE_CALLBACK,(this->super_TestCaseGroup).m_context,
                             "externally_generated","Externally Generated Messages",&local_240)->
            super_TestNode;
  this_00 = (BaseCase *)operator_new(0xf8);
  anon_unknown_1::BaseCase::BaseCase
            (this_00,(this->super_TestCaseGroup).m_context,"push_pop_consistency",
             "Push/pop message generation with full message output checking");
  (this_00->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GroupCase_00b27048;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x0;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx =
       (TestContext *)0x0;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       (pointer)&this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.
                 field_2;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
       0;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.field_2.
  _M_local_buf[0] = '\0';
  tcu::TestNode::addChild(pTVar9,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  local_258 = (TestFunctionWrapper *)0x0;
  cStack_250._M_current = (FunctionContainer *)0x0;
  local_248 = 0;
  local_218 = (TestFunctionWrapper *)0x0;
  local_228 = (TestFunctionWrapper *)0x0;
  iStack_220._M_current = (TestFunctionWrapper *)0x0;
  uVar7 = tcu::CommandLine::getBaseSeed
                    (((this->super_TestCaseGroup).m_context)->m_testCtx->m_cmdLine);
  deRandom_init(&local_40,uVar7 ^ 0x53941903);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
  ::
  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              *)&local_258,(const_iterator)0x0,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_1f0.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_1f0.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
  ::
  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              *)&local_258,cStack_250,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_208.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_208.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
  ::
  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              *)&local_258,cStack_250,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_240.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_240.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  if ((long)cStack_250._M_current - (long)local_258 == 0) {
    iVar13._M_current = (TestFunctionWrapper *)0x0;
    pTVar23 = (TestFunctionWrapper *)0x0;
  }
  else {
    lVar29 = (long)cStack_250._M_current - (long)local_258 >> 5;
    lVar29 = lVar29 + (ulong)(lVar29 == 0);
    pTVar22 = local_258;
    do {
      if (iStack_220._M_current == local_218) {
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
        ::
        _M_realloc_insert<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_const&>
                  ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                    *)&local_228,iStack_220,pTVar22);
      }
      else {
        uVar2 = *(undefined4 *)&pTVar22->field_0x4;
        aVar5 = pTVar22->m_func;
        (iStack_220._M_current)->m_type = pTVar22->m_type;
        *(undefined4 *)&(iStack_220._M_current)->field_0x4 = uVar2;
        (iStack_220._M_current)->m_func = aVar5;
        iStack_220._M_current = iStack_220._M_current + 1;
      }
      pTVar22 = pTVar22 + 2;
      lVar29 = lVar29 + -1;
      iVar13._M_current = iStack_220._M_current;
      pTVar23 = local_228;
    } while (lVar29 != 0);
  }
  local_410 = (TestNode *)((ulong)((long)iVar13._M_current - (long)pTVar23) >> 4);
  uVar7 = (int)local_410 - 1;
  if (0 < (int)uVar7) {
    uVar30 = (ulong)uVar7 + 1;
    paVar28 = (anon_union_8_2_9b810bd7_for_m_func *)(pTVar23 + uVar7);
    do {
      dVar8 = deRandom_getUint32(&local_40);
      uVar26 = (ulong)dVar8 % (uVar30 & 0xffffffff);
      local_3e8 = *paVar28;
      aStack_3e0 = paVar28[1];
      aVar5 = ((anon_union_8_2_9b810bd7_for_m_func *)(pTVar23 + uVar26))[1];
      *paVar28 = *(anon_union_8_2_9b810bd7_for_m_func *)(pTVar23 + uVar26);
      paVar28[1] = aVar5;
      *(anon_union_8_2_9b810bd7_for_m_func *)(pTVar23 + uVar26) = local_3e8;
      ((anon_union_8_2_9b810bd7_for_m_func *)(pTVar23 + uVar26))[1] = aStack_3e0;
      uVar30 = uVar30 - 1;
      paVar28 = paVar28 + -2;
    } while (1 < uVar30);
  }
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "error_filters","Filtering of reported errors");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  uVar7 = (int)local_410 + 3;
  if (3 < (int)uVar7) {
    uVar7 = uVar7 >> 2;
    local_260 = 0x20;
    if (uVar7 < 0x20) {
      local_260 = (ulong)uVar7;
    }
    local_270 = (FunctionContainer *)(long)(int)local_410;
    iVar25 = 4;
    local_440 = (TestNode *)0x0;
    uVar30 = 0;
    local_268 = pTVar9;
    do {
      local_418 = (TestFunctionWrapper *)CONCAT44(local_418._4_4_,iVar25);
      pFVar27 = (FunctionContainer *)(long)iVar25;
      if ((long)local_270 <= (long)iVar25) {
        pFVar27 = local_270;
      }
      iVar25 = (int)uVar30 * 4 + 4;
      if ((int)local_410 <= iVar25) {
        iVar25 = (int)local_410;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3e8);
      std::ostream::operator<<(&local_3e8,(int)uVar30);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3e8);
      std::ios_base::~ios_base(local_378);
      plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,0x941093);
      plVar10 = &local_450;
      plVar19 = plVar14 + 2;
      if ((long *)*plVar14 == plVar19) {
        local_450 = *plVar19;
        lStack_448 = plVar14[3];
        local_460 = plVar10;
      }
      else {
        local_450 = *plVar19;
        local_460 = (long *)*plVar14;
      }
      local_458 = plVar14[1];
      *plVar14 = (long)plVar19;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if (local_438 != (allocator_type *)&local_428) {
        plVar10 = (long *)(local_428 + 1);
        operator_delete(local_438,(ulong)plVar10);
      }
      aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)0x0;
      lVar29 = (long)iVar25 * 0x10 + uVar30 * -0x40;
      this_01 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                 *)(lVar29 >> 4);
      if ((ulong)this_01 >> 0x3b != 0) {
        std::__throw_length_error("cannot create std::vector larger than max_size()");
      }
      local_3e8.coreFn =
           (CoreTestFunc)
           std::
           _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
           ::_M_allocate(this_01,(size_t)plVar10);
      pTVar9 = local_268;
      local_3d8[0].function = local_3e8.coreFn + lVar29;
      aStack_3e0.coreFn = local_3e8.coreFn;
      if ((long)iVar25 * 0x10 != uVar30 * 0x40) {
        lVar29 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pTVar23->m_type + lVar29);
          uVar6 = puVar1[1];
          *(undefined8 *)(local_3e8.coreFn + lVar29) = *puVar1;
          *(undefined8 *)(local_3e8.coreFn + lVar29 + 8) = uVar6;
          lVar29 = lVar29 + 0x10;
        } while ((long)local_440 + (long)pFVar27 * 0x10 != lVar29);
        aStack_3e0.coreFn = local_3e8.coreFn + lVar29;
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
      ::insert((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                *)&local_3e8,(const_iterator)aStack_3e0,
               &local_240.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_start
                [uVar30 % (ulong)((long)local_240.
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_240.
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5)].function);
      pFVar15 = (FilterCase *)operator_new(0xe8);
      anon_unknown_1::FilterCase::FilterCase
                (pFVar15,(this->super_TestCaseGroup).m_context,(char *)local_460,
                 "DebugMessageControl usage",
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  *)&local_3e8);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pFVar15);
      if ((pointer)local_3e8.coreFn != (pointer)0x0) {
        operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
      }
      if (local_460 != &local_450) {
        operator_delete(local_460,local_450 + 1);
      }
      uVar30 = uVar30 + 1;
      local_440 = (TestNode *)((long)local_440 + -0x40);
      iVar25 = (int)local_418 + 4;
      pTVar23 = pTVar23 + 4;
    } while (uVar30 != local_260);
  }
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"error_groups"
             ,"Filtering of reported errors with use of Error Groups");
  local_418 = local_228;
  local_440 = (TestNode *)((ulong)((long)iStack_220._M_current - (long)local_228) >> 4);
  iVar21 = (int)local_440 + 3;
  iVar25 = (int)local_440 + 6;
  if (-1 < iVar21) {
    iVar25 = iVar21;
  }
  local_410 = pTVar9;
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  if (3 < iVar21) {
    local_270 = local_240.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_268 = (TestNode *)
                ((long)local_240.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_240.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
    uVar24 = (iVar25 >> 2) - 1;
    uVar7 = 0xf;
    if (uVar24 < 0xf) {
      uVar7 = uVar24;
    }
    local_260 = (ulong)(uVar7 + 1);
    uVar7 = 4;
    uVar30 = 0;
    pTVar23 = local_418;
    do {
      uVar26 = (ulong)local_440 & 0xffffffff;
      if ((int)uVar7 < (int)local_440) {
        uVar26 = (ulong)uVar7;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3e8);
      std::ostream::operator<<(&local_3e8,(int)uVar30);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3e8);
      std::ios_base::~ios_base(local_378);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_408,0,(char *)0x0,0x941093);
      local_438 = (allocator_type *)&local_428;
      paVar20 = (allocator_type *)(plVar10 + 2);
      if ((allocator_type *)*plVar10 == paVar20) {
        local_428 = *(long *)paVar20;
        lStack_420 = plVar10[3];
      }
      else {
        local_428 = *(long *)paVar20;
        local_438 = (allocator_type *)*plVar10;
      }
      local_430 = plVar10[1];
      *plVar10 = (long)paVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,(char *)local_438,(allocator<char> *)&local_3e8);
      if (local_438 != (allocator_type *)&local_428) {
        operator_delete(local_438,local_428 + 1);
      }
      if (local_408[0] != local_3f8) {
        operator_delete(local_408[0],local_3f8[0] + 1);
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
      ::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*,void>
                ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                  *)&local_3e8,pTVar23,local_418 + uVar26,paVar20);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
      ::insert((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                *)&local_3e8,(const_iterator)aStack_3e0,
               &local_270[uVar30 % (ulong)local_268].function);
      pFVar15 = (FilterCase *)operator_new(0xe8);
      anon_unknown_1::FilterCase::FilterCase
                (pFVar15,(this->super_TestCaseGroup).m_context,(char *)local_460,"Debug Group usage"
                 ,(vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                   *)&local_3e8);
      (pFVar15->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode = (_func_int **)&PTR__FilterCase_00b27118;
      tcu::TestNode::addChild(local_410,(TestNode *)pFVar15);
      if ((pointer)local_3e8.coreFn != (pointer)0x0) {
        operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
      }
      if (local_460 != &local_450) {
        operator_delete(local_460,local_450 + 1);
      }
      uVar30 = uVar30 + 1;
      uVar7 = uVar7 + 4;
      pTVar23 = pTVar23 + 4;
    } while (local_260 != uVar30);
  }
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"async",
             "Asynchronous message generation");
  pTVar23 = local_418;
  local_410 = pTVar9;
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  uVar7 = (int)local_440 + 1;
  pTVar22 = pTVar23;
  if (1 < (int)uVar7) {
    uVar7 = uVar7 >> 1;
    local_270 = (FunctionContainer *)&DAT_00000010;
    if (uVar7 < 0x10) {
      local_270 = (FunctionContainer *)(ulong)uVar7;
    }
    iVar25 = 2;
    pFVar27 = (FunctionContainer *)0x0;
    do {
      iVar21 = (int)local_440;
      if (iVar25 < (int)local_440) {
        iVar21 = iVar25;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3e8);
      std::ostream::operator<<(&local_3e8,(int)pFVar27);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3e8);
      std::ios_base::~ios_base(local_378);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_408,0,(char *)0x0,0x941093);
      local_438 = (allocator_type *)&local_428;
      paVar20 = (allocator_type *)(plVar10 + 2);
      if ((allocator_type *)*plVar10 == paVar20) {
        local_428 = *(long *)paVar20;
        lStack_420 = plVar10[3];
      }
      else {
        local_428 = *(long *)paVar20;
        local_438 = (allocator_type *)*plVar10;
      }
      local_430 = plVar10[1];
      *plVar10 = (long)paVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,(char *)local_438,(allocator<char> *)&local_3e8);
      if (local_438 != (allocator_type *)&local_428) {
        operator_delete(local_438,local_428 + 1);
      }
      if (local_408[0] != local_3f8) {
        operator_delete(local_408[0],local_3f8[0] + 1);
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
      ::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*,void>
                ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                  *)&local_438,pTVar23,pTVar22 + iVar21,paVar20);
      if (((ulong)pFVar27 & 1) == 0) {
        pAVar16 = (AsyncCase *)operator_new(0x120);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        local_3e8.coreFn = (CoreTestFunc)local_3d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,local_460,(long)local_460 + local_458);
        std::__cxx11::string::append((char *)&local_3e8);
        anon_unknown_1::AsyncCase::AsyncCase
                  (pAVar16,pCVar4,(char *)local_3e8.coreFn,(char *)&local_438,
                   (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                    *)0x0,(bool)in_R9B);
        tcu::TestNode::addChild(local_410,(TestNode *)pAVar16);
      }
      else {
        pAVar16 = (AsyncCase *)operator_new(0x120);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        local_3e8.coreFn = (CoreTestFunc)local_3d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,local_460,(long)local_460 + local_458);
        std::__cxx11::string::append((char *)&local_3e8);
        anon_unknown_1::AsyncCase::AsyncCase
                  (pAVar16,pCVar4,(char *)local_3e8.coreFn,(char *)&local_438,
                   (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                    *)&DAT_00000001,(bool)in_R9B);
        tcu::TestNode::addChild(local_410,(TestNode *)pAVar16);
      }
      pTVar22 = local_418;
      if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
        operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
      }
      if (local_438 != (allocator_type *)0x0) {
        operator_delete(local_438,local_428 - (long)local_438);
      }
      if (local_460 != &local_450) {
        operator_delete(local_460,local_450 + 1);
      }
      pFVar27 = (FunctionContainer *)((long)&(pFVar27->function).m_type + 1);
      iVar25 = iVar25 + 2;
      pTVar23 = pTVar23 + 2;
    } while (local_270 != pFVar27);
  }
  if (pTVar22 != (TestFunctionWrapper *)0x0) {
    operator_delete(pTVar22,(long)local_218 - (long)pTVar22);
  }
  if (local_258 != (TestFunctionWrapper *)0x0) {
    operator_delete(local_258,local_248 - (long)local_258);
  }
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "object_labels","Labeling objects");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar4->m_testCtx,"initial","Debug label initial value");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b271e8;
  tcu::TestNode::addChild(pTVar9,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar4->m_testCtx,"clearing","Debug label clearing");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b27238;
  tcu::TestNode::addChild(pTVar9,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar4->m_testCtx,"specify_with_length",
             "Debug label specified with length");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b272c0;
  tcu::TestNode::addChild(pTVar9,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar4->m_testCtx,"buffer_limited_query",
             "Debug label query to too short buffer");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b27310;
  tcu::TestNode::addChild(pTVar9,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar4->m_testCtx,"max_label_length","Max sized debug label");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b27360;
  tcu::TestNode::addChild(pTVar9,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar4->m_testCtx,"query_length_only","Query debug label length");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b273b0;
  tcu::TestNode::addChild(pTVar9,pTVar11);
  lVar29 = 0x10;
  do {
    pTVar11 = (TestNode *)operator_new(0x80);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    uVar2 = *(undefined4 *)((long)&init::limits[3].targetName + lVar29);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar11,pCVar4->m_testCtx,
               *(char **)((long)&init::limits[3].target + lVar29),
               *(char **)((long)&DAT_00b26bb0 + lVar29));
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b27400;
    *(undefined4 *)&pTVar11[1].m_testCtx = uVar2;
    tcu::TestNode::addChild(pTVar9,pTVar11);
    lVar29 = lVar29 + 0x18;
  } while (lVar29 != 0x100);
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar4->m_testCtx,"sync","Debug label on a sync object");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b27450;
  tcu::TestNode::addChild(pTVar9,pTVar11);
  iVar25 = extraout_EAX;
  if (local_240.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (FunctionContainer *)0x0) {
    operator_delete(local_240.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_00;
  }
  if (local_1d8.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_01;
  }
  if (local_1c0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_02;
  }
  if (local_1a8.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_03;
  }
  if (local_190.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_04;
  }
  if (local_178.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_05;
  }
  if (local_160.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_06;
  }
  if (local_148.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_07;
  }
  if (local_130.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_08;
  }
  if (local_118.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_09;
  }
  if (local_100.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_10;
  }
  if (local_e8.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_11;
  }
  if (local_d0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_12;
  }
  if (local_b8.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_13;
  }
  if (local_a0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_14;
  }
  if (local_88.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_15;
  }
  if (local_70.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_16;
  }
  if (local_58.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_17;
  }
  if (local_208.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (FunctionContainer *)0x0) {
    operator_delete(local_208.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_18;
  }
  if (local_1f0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (FunctionContainer *)0x0) {
    operator_delete(local_1f0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar25 = extraout_EAX_19;
  }
  return iVar25;
}

Assistant:

void DebugTests::init (void)
{
	const vector<FunctionContainer> bufferFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeBufferApiTestFunctions());
	const vector<FunctionContainer> textureFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeTextureApiTestFunctions());
	const vector<FunctionContainer> shaderFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderApiTestFunctions());
	const vector<FunctionContainer> fragmentFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeFragmentApiTestFunctions());
	const vector<FunctionContainer> vaFuncs					 = wrapCoreFunctions(NegativeTestShared::getNegativeVertexArrayApiTestFunctions());
	const vector<FunctionContainer> stateFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeStateApiTestFunctions());
	const vector<FunctionContainer> tessellationFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeTessellationTestFunctions());
	const vector<FunctionContainer> atomicCounterFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeAtomicCounterTestFunctions());
	const vector<FunctionContainer> imageLoadFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageLoadTestFunctions());
	const vector<FunctionContainer> imageStoreFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageStoreTestFunctions());
	const vector<FunctionContainer> imageAtomicFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageAtomicTestFunctions());
	const vector<FunctionContainer> imageAtomicExchangeFuncs = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageAtomicExchangeTestFunctions());
	const vector<FunctionContainer> shaderFunctionFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderFunctionTestFunctions());
	const vector<FunctionContainer> shaderDirectiveFuncs	 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderDirectiveTestFunctions());
	const vector<FunctionContainer> ssboBlockFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeSSBOBlockTestFunctions());
	const vector<FunctionContainer> preciseFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativePreciseTestFunctions());
	const vector<FunctionContainer> advancedBlendFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeAdvancedBlendEquationTestFunctions());
	const vector<FunctionContainer> shaderStorageFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderStorageTestFunctions());
	const vector<FunctionContainer> computeFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeComputeTestFunctions());
	const vector<FunctionContainer> externalFuncs			 = getUserMessageFuncs();

	{
		using namespace gls::StateQueryUtil;

		tcu::TestCaseGroup* const queries = new tcu::TestCaseGroup(m_testCtx, "state_query", "State query");

		static const struct
		{
			const char*	name;
			const char*	targetName;
			glw::GLenum	target;
			int			limit;
		} limits[] =
		{
			{ "max_debug_message_length",		"MAX_DEBUG_MESSAGE_LENGTH",		GL_MAX_DEBUG_MESSAGE_LENGTH,	1	},
			{ "max_debug_logged_messages",		"MAX_DEBUG_LOGGED_MESSAGES",	GL_MAX_DEBUG_LOGGED_MESSAGES,	1	},
			{ "max_debug_group_stack_depth",	"MAX_DEBUG_GROUP_STACK_DEPTH",	GL_MAX_DEBUG_GROUP_STACK_DEPTH,	64	},
			{ "max_label_length",				"MAX_LABEL_LENGTH",				GL_MAX_LABEL_LENGTH,			256	},
		};

		addChild(queries);

		#define FOR_ALL_TYPES(X) \
			do \
			{ \
				{ \
					const char* const	postfix = "_getboolean"; \
					const QueryType		queryType = QUERY_BOOLEAN; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getinteger"; \
					const QueryType		queryType = QUERY_INTEGER; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getinteger64"; \
					const QueryType		queryType = QUERY_INTEGER64; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getfloat"; \
					const QueryType		queryType = QUERY_FLOAT; \
					X; \
				} \
			} \
			while (deGetFalse())
		#define FOR_ALL_ENABLE_TYPES(X) \
			do \
			{ \
				{ \
					const char* const	postfix = "_isenabled"; \
					const QueryType		queryType = QUERY_ISENABLED; \
					X; \
				} \
				FOR_ALL_TYPES(X); \
			} \
			while (deGetFalse())

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(limits); ++ndx)
		{
			FOR_ALL_TYPES(queries->addChild(new LimitQueryCase(m_context,
															   (std::string(limits[ndx].name) + postfix).c_str(),
															   (std::string("Test ") + limits[ndx].targetName).c_str(),
															   limits[ndx].target, limits[ndx].limit, queryType)));
		}

		FOR_ALL_ENABLE_TYPES(queries->addChild(new IsEnabledCase	(m_context, (std::string("debug_output") + postfix).c_str(),						"Test DEBUG_OUTPUT",						GL_DEBUG_OUTPUT,				IsEnabledCase::INITIAL_CTX_IS_DEBUG,	queryType)));
		FOR_ALL_ENABLE_TYPES(queries->addChild(new IsEnabledCase	(m_context, (std::string("debug_output_synchronous") + postfix).c_str(),			"Test DEBUG_OUTPUT_SYNCHRONOUS",			GL_DEBUG_OUTPUT_SYNCHRONOUS,	IsEnabledCase::INITIAL_FALSE,			queryType)));

		FOR_ALL_TYPES(queries->addChild(new PositiveIntegerCase		(m_context, (std::string("debug_logged_messages") + postfix).c_str(),				"Test DEBUG_LOGGED_MESSAGES",				GL_DEBUG_LOGGED_MESSAGES,				queryType)));
		FOR_ALL_TYPES(queries->addChild(new PositiveIntegerCase		(m_context, (std::string("debug_next_logged_message_length") + postfix).c_str(),	"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",	GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH,	queryType)));
		FOR_ALL_TYPES(queries->addChild(new GroupStackDepthQueryCase(m_context, (std::string("debug_group_stack_depth") + postfix).c_str(),				"Test DEBUG_GROUP_STACK_DEPTH",				queryType)));

		queries->addChild(new DebugCallbackFunctionCase	(m_context, "debug_callback_function_getpointer",	"Test DEBUG_CALLBACK_FUNCTION"));
		queries->addChild(new DebugCallbackUserParamCase(m_context, "debug_callback_user_param_getpointer", "Test DEBUG_CALLBACK_USER_PARAM"));

		#undef FOR_ALL_TYPES
		#undef FOR_ALL_ENABLE_TYPES
	}

	{
		tcu::TestCaseGroup* const	negative	= new tcu::TestCaseGroup(m_testCtx, "negative_coverage", "API error coverage with various reporting methods");

		addChild(negative);
		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "callbacks", "Reporting of standard API errors via callback");

			negative->addChild(host);
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "buffer",						"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader",						"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "fragment",					"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "vertex_array",				"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "state",						"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "atomic_counter",				"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_load",			"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_store",			"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_exchange",		"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_directive",			"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "ssbo_block",					"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "advanced_blend",				"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_storage",				"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "tessellation",				"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}

		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "log", "Reporting of standard API errors via log");

			negative->addChild(host);

			host->addChild(createChildCases(CASETYPE_LOG, m_context, "buffer",					"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader",					"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "fragment",				"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "vertex_array",			"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "state",					"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "atomic_counter",			"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_load",		"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_store",		"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_exchange",	"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_directive",		"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "ssbo_block",				"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "advanced_blend",			"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_storage",			"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "tessellation",			"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}

		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "get_error", "Reporting of standard API errors via glGetError");

			negative->addChild(host);

			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "buffer",						"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader",						"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "fragment",					"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "vertex_array",				"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "state",						"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "atomic_counter",				"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_load",			"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_store",			"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_exchange",		"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_directive",			"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "ssbo_block",					"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "advanced_blend",				"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_storage",				"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "tessellation",				"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}
	}

	{
		tcu::TestCaseGroup* const host = createChildCases(CASETYPE_CALLBACK, m_context, "externally_generated", "Externally Generated Messages", externalFuncs);

		host->addChild(new GroupCase(m_context, "push_pop_consistency", "Push/pop message generation with full message output checking"));

		addChild(host);
	}

	{
		vector<FunctionContainer>	containers;
		vector<TestFunctionWrapper>	allFuncs;

		de::Random					rng			(0x53941903 ^ m_context.getTestContext().getCommandLine().getBaseSeed());

		containers.insert(containers.end(), bufferFuncs.begin(), bufferFuncs.end());
		containers.insert(containers.end(), textureFuncs.begin(), textureFuncs.end());
		containers.insert(containers.end(), externalFuncs.begin(), externalFuncs.end());

		for (size_t ndx = 0; ndx < containers.size(); ndx++)
			allFuncs.push_back(containers[ndx].function);

		rng.shuffle(allFuncs.begin(), allFuncs.end());

		{
			tcu::TestCaseGroup* const	filtering				= new tcu::TestCaseGroup(m_testCtx, "error_filters", "Filtering of reported errors");
			const int					errorFuncsPerCase		= 4;
			const int					maxFilteringCaseCount	= 32;
			const int					caseCount				= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(filtering);

			for (int caseNdx = 0; caseNdx < de::min(caseCount, maxFilteringCaseCount); caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= "case_" + de::toString(caseNdx);
				vector<TestFunctionWrapper>	funcs		(allFuncs.begin()+start, allFuncs.begin()+end);

				// These produce lots of different message types, thus always include at least one when testing filtering
				funcs.insert(funcs.end(), externalFuncs[caseNdx%externalFuncs.size()].function);

				filtering->addChild(new FilterCase(m_context, name.c_str(), "DebugMessageControl usage", funcs));
			}
		}

		{
			tcu::TestCaseGroup* const	groups					= new tcu::TestCaseGroup(m_testCtx, "error_groups", "Filtering of reported errors with use of Error Groups");
			const int					errorFuncsPerCase		= 4;
			const int					maxFilteringCaseCount	= 16;
			const int					caseCount				= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(groups);

			for (int caseNdx = 0; caseNdx < caseCount && caseNdx < maxFilteringCaseCount; caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= ("case_" + de::toString(caseNdx)).c_str();
				vector<TestFunctionWrapper>	funcs		(&allFuncs[0]+start, &allFuncs[0]+end);

				// These produce lots of different message types, thus always include at least one when testing filtering
				funcs.insert(funcs.end(), externalFuncs[caseNdx%externalFuncs.size()].function);

				groups->addChild(new GroupFilterCase(m_context, name.c_str(), "Debug Group usage", funcs));
			}
		}

		{
			tcu::TestCaseGroup* const	async				= new tcu::TestCaseGroup(m_testCtx, "async", "Asynchronous message generation");
			const int					errorFuncsPerCase	= 2;
			const int					maxAsyncCaseCount	= 16;
			const int					caseCount			= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(async);

			for (int caseNdx = 0; caseNdx < caseCount && caseNdx < maxAsyncCaseCount; caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= ("case_" + de::toString(caseNdx)).c_str();
				vector<TestFunctionWrapper>	funcs		(&allFuncs[0]+start, &allFuncs[0]+end);

				if (caseNdx&0x1)
					async->addChild(new AsyncCase(m_context, (name+"_callback").c_str(), "Async message generation", funcs, true));
				else
					async->addChild(new AsyncCase(m_context, (name+"_log").c_str(), "Async message generation", funcs, false));
			}
		}
	}

	{
		tcu::TestCaseGroup* const labels = new tcu::TestCaseGroup(m_testCtx, "object_labels", "Labeling objects");

		const struct
		{
			GLenum		identifier;
			const char*	name;
			const char* desc;
		} cases[] =
		{
			{ GL_BUFFER,				"buffer",				"Debug label on a buffer object"				},
			{ GL_SHADER,				"shader",				"Debug label on a shader object"				},
			{ GL_PROGRAM,				"program",				"Debug label on a program object"				},
			{ GL_QUERY,					"query",				"Debug label on a query object"					},
			{ GL_PROGRAM_PIPELINE,		"program_pipeline",		"Debug label on a program pipeline object"		},
			{ GL_TRANSFORM_FEEDBACK,	"transform_feedback",	"Debug label on a transform feedback object"	},
			{ GL_SAMPLER,				"sampler",				"Debug label on a sampler object"				},
			{ GL_TEXTURE,				"texture",				"Debug label on a texture object"				},
			{ GL_RENDERBUFFER,			"renderbuffer",			"Debug label on a renderbuffer object"			},
			{ GL_FRAMEBUFFER,			"framebuffer",			"Debug label on a framebuffer object"			},
		};

		addChild(labels);

		labels->addChild(new InitialLabelCase		(m_context, "initial",				"Debug label initial value"));
		labels->addChild(new ClearLabelCase			(m_context, "clearing",				"Debug label clearing"));
		labels->addChild(new SpecifyWithLengthCase	(m_context, "specify_with_length",	"Debug label specified with length"));
		labels->addChild(new BufferLimitedLabelCase	(m_context, "buffer_limited_query",	"Debug label query to too short buffer"));
		labels->addChild(new LabelMaxSizeCase		(m_context, "max_label_length",		"Max sized debug label"));
		labels->addChild(new LabelLengthCase		(m_context, "query_length_only",	"Query debug label length"));

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
			labels->addChild(new LabelCase(m_context, cases[ndx].name, cases[ndx].desc, cases[ndx].identifier));
		labels->addChild(new SyncLabelCase(m_context, "sync", "Debug label on a sync object"));
	}
}